

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::verifyBooleanVec4
               (ResultCollector *result,QueriedState *state,BVec4 *expected)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  _Alloc_hider _Var9;
  uint uVar10;
  undefined1 uVar15;
  uint uVar17;
  undefined1 auVar11 [16];
  GLboolean resultVec4 [4];
  GLboolean referenceVec4 [4];
  GLint64 reference [4];
  GLuint reference_1 [4];
  ostringstream buf;
  undefined1 local_1e0 [8];
  string local_1d8;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined2 uVar16;
  
  uVar6 = state->m_type - DATATYPE_FLOAT_VEC4;
  if (4 < uVar6) {
    return;
  }
  switch(state->m_type) {
  case DATATYPE_FLOAT_VEC4:
    uVar1 = *(undefined4 *)expected->m_data;
    uVar15 = (undefined1)((uint)uVar1 >> 0x18);
    uVar16 = CONCAT11(uVar15,uVar15);
    uVar15 = (undefined1)((uint)uVar1 >> 0x10);
    uVar3 = CONCAT35(CONCAT21(uVar16,uVar15),CONCAT14(uVar15,uVar1));
    uVar15 = (undefined1)((uint)uVar1 >> 8);
    uVar4 = CONCAT53(CONCAT41((int)((ulong)uVar3 >> 0x20),uVar15),CONCAT12(uVar15,(short)uVar1));
    uVar5 = CONCAT62((int6)((ulong)uVar4 >> 0x10),(short)uVar1) & 0xffffffffffff00ff;
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar5;
    auVar14._12_2_ = uVar16;
    auVar14._14_2_ = uVar16;
    uVar16 = (undefined2)((ulong)uVar3 >> 0x20);
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar5;
    auVar13._10_2_ = uVar16;
    auVar12._10_6_ = auVar13._10_6_;
    auVar12._8_2_ = uVar16;
    auVar12._0_8_ = uVar5;
    uVar16 = (undefined2)((ulong)uVar4 >> 0x10);
    auVar11._8_8_ = auVar12._8_8_;
    auVar11._6_2_ = uVar16;
    auVar11._0_4_ = (int)uVar5;
    auVar11._4_2_ = uVar16;
    uVar10 = (auVar11._0_4_ << 0x1f) >> 0x1f;
    uVar17 = (auVar11._4_4_ << 0x1f) >> 0x1f;
    fStack_1b0 = (float)((auVar12._8_4_ << 0x1f) >> 0x1f & 0x3f800000);
    fStack_1ac = (float)((auVar13._12_4_ << 0x1f) >> 0x1f & 0x3f800000);
    local_1b8 = (undefined1  [8])(CONCAT44(uVar17,uVar10) & 0x3f8000003f800000);
    auVar2._4_4_ = -(uint)((state->m_v).vFloatVec4[1] != (float)(uVar17 & 0x3f800000));
    auVar2._0_4_ = -(uint)((state->m_v).vFloat != (float)(uVar10 & 0x3f800000));
    auVar2._8_4_ = -(uint)((state->m_v).vFloatVec4[2] != fStack_1b0);
    auVar2._12_4_ = -(uint)((state->m_v).vFloatVec4[3] != fStack_1ac);
    iVar7 = movmskps((&switchD_004977d6::switchdataD_0066dc9c)[uVar6] + 0x66dc9c,auVar2);
    if (iVar7 == 0) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar8 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ",6);
    local_1d8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    tcu::Format::operator<<(poVar8,(ArrayPointer<float> *)&local_1d8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER_VEC4:
    local_1b8._0_4_ = CONCAT31(0,expected->m_data[0]);
    local_1b8[4] = expected->m_data[1];
    local_1b8._5_3_ = 0;
    fStack_1b0 = (float)(uint)expected->m_data[2];
    fStack_1ac = (float)(uint)expected->m_data[3];
    if ((((state->m_v).vInt == local_1b8._0_4_) &&
        ((state->m_v).vIntVec3[1] == (uint)expected->m_data[1])) &&
       (((float)(state->m_v).vIntVec3[2] == fStack_1b0 &&
        ((float)(state->m_v).vIntVec3[3] == fStack_1ac)))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar8 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ",6);
    local_1d8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    tcu::Format::operator<<(poVar8,(ArrayPointer<int> *)&local_1d8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER64_VEC4:
    local_1d8._M_dataplus._M_p = (pointer)(ulong)expected->m_data[0];
    local_1d8._M_string_length = (size_type)expected->m_data[1];
    local_1d8.field_2._M_allocated_capacity = (size_type)expected->m_data[2];
    local_1d8.field_2._8_8_ = ZEXT18(expected->m_data[3]);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(state->m_v).vInt64 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p) &&
        ((state->m_v).vInt64Vec4[1] == local_1d8._M_string_length)) &&
       (((state->m_v).vInt64Vec4[2] == local_1d8.field_2._M_allocated_capacity &&
        ((state->m_v).vInt64Vec4[3] == local_1d8.field_2._8_8_)))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar8 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ",6);
    local_1b8 = (undefined1  [8])&state->m_v;
    fStack_1b0 = 5.60519e-45;
    tcu::Format::operator<<(poVar8,(ArrayPointer<long> *)local_1b8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,(string *)local_1b8);
    _Var9._M_p = (pointer)local_1b8;
    if (local_1b8 == (undefined1  [8])&local_1a8) goto LAB_00497bec;
    goto LAB_00497be4;
  case DATATYPE_UNSIGNED_INTEGER_VEC4:
    local_1b8._0_4_ = CONCAT31(0,expected->m_data[0]);
    local_1b8[4] = expected->m_data[1];
    local_1b8._5_3_ = 0;
    fStack_1b0 = (float)(uint)expected->m_data[2];
    fStack_1ac = (float)(uint)expected->m_data[3];
    if (((((state->m_v).vInt == local_1b8._0_4_) &&
         ((state->m_v).vIntVec3[1] == (uint)expected->m_data[1])) &&
        ((float)(state->m_v).vIntVec3[2] == fStack_1b0)) &&
       ((float)(state->m_v).vIntVec3[3] == fStack_1ac)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar8 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ",6);
    local_1d8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    tcu::Format::operator<<(poVar8,(ArrayPointer<unsigned_int> *)&local_1d8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_BOOLEAN_VEC4:
    local_1e0[4] = expected->m_data[0];
    local_1e0[5] = expected->m_data[1];
    local_1e0[6] = expected->m_data[2];
    local_1e0[7] = expected->m_data[3];
    local_1e0[0] = (state->m_v).vBool;
    local_1e0[1] = (state->m_v).vBooleanVec4[1];
    local_1e0[2] = (state->m_v).vBooleanVec4[2];
    local_1e0[3] = (state->m_v).vBooleanVec4[3];
    if ((local_1e0[1] == local_1e0[5] && local_1e0[0] == local_1e0[4]) &&
       (local_1e0[3] == local_1e0[7] && local_1e0[2] == local_1e0[6])) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    local_1d8._M_dataplus._M_p = local_1e0 + 4;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    poVar8 = glu::detail::operator<<((ostream *)local_190,(BooleanPointerFmt *)&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ",6);
    local_1b8 = (undefined1  [8])local_1e0;
    fStack_1b0 = 5.60519e-45;
    glu::detail::operator<<(poVar8,(BooleanPointerFmt *)local_1b8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
  }
  local_1a8._M_allocated_capacity = local_1d8.field_2._M_allocated_capacity;
  _Var9._M_p = local_1d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_00497be4:
    operator_delete(_Var9._M_p,local_1a8._M_allocated_capacity + 1);
  }
LAB_00497bec:
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}